

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

int __thiscall libtorrent::rename(libtorrent *this,char *__old,char *__new)

{
  __type_conflict1 _Var1;
  int iVar2;
  int *piVar3;
  native_path_string f1;
  native_path_string f2;
  string local_50;
  string local_30;
  
  __new[0] = '\0';
  __new[1] = '\0';
  __new[2] = '\0';
  __new[3] = '\0';
  __new[4] = '\0';
  *(system_error_category **)(__new + 8) =
       &boost::system::detail::cat_holder<void>::system_category_instance;
  convert_to_native(&local_50,(string *)this);
  convert_to_native(&local_30,(string *)__old);
  _Var1 = ::std::operator==(&local_50,&local_30);
  if (!_Var1) {
    iVar2 = ::rename(local_50._M_dataplus._M_p,local_30._M_dataplus._M_p);
    if (iVar2 < 0) {
      piVar3 = __errno_location();
      boost::system::error_code::assign
                ((error_code *)__new,*piVar3,
                 &boost::system::detail::cat_holder<void>::generic_category_instance.
                  super_error_category);
    }
  }
  ::std::__cxx11::string::~string((string *)&local_30);
  iVar2 = ::std::__cxx11::string::~string((string *)&local_50);
  return iVar2;
}

Assistant:

void rename(std::string const& inf, std::string const& newf, error_code& ec)
	{
		ec.clear();

		native_path_string f1 = convert_to_native_path_string(inf);
		native_path_string f2 = convert_to_native_path_string(newf);

		if (f1 == f2) return;

#if defined TORRENT_WINDOWS
#define RenameFunction_ ::_wrename
#else
#define RenameFunction_ ::rename
#endif

		if (RenameFunction_(f1.c_str(), f2.c_str()) < 0)
		{
			ec.assign(errno, generic_category());
		}
#undef RenameFunction_
	}